

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void riffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  float *ioptr_00;
  long StageCnt_00;
  float *in_RCX;
  long in_RDX;
  long in_RSI;
  float *in_RDI;
  long in_R8;
  float scale_00;
  long unaff_retaddr;
  long NDiffU;
  long StageCnt;
  float scale;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  float *in_stack_00000080;
  long in_stack_00000088;
  float *in_stack_00000090;
  undefined4 in_stack_ffffffffffffffd0;
  
  scale_00 = (float)(double)(0x3ff0000000000000 - (in_RSI << 0x34));
  ioptr_00 = (float *)(in_RSI + -1);
  switch(in_RSI) {
  case 0:
    break;
  case 1:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rifft1pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
  case 2:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rifft2pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  case 3:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rifft4pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  case 4:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      rifft8pt(in_RDI,scale_00);
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
    break;
  default:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      ifrstage(in_RDI,(long)ioptr_00 + 1,in_RCX);
      scbitrevR2((float *)NDiffU,unaff_retaddr,(short *)in_RDI,(float)((ulong)ioptr_00 >> 0x20));
      StageCnt_00 = ((long)ioptr_00 + -1) / 3;
      if ((long)ioptr_00 + StageCnt_00 * -3 + -1 == 1) {
        ibfR2(in_RCX,in_R8,CONCAT44(scale_00,in_stack_ffffffffffffffd0));
      }
      if ((long)ioptr_00 + StageCnt_00 * -3 + -1 == 2) {
        ibfR4(ioptr_00,in_RDX,(long)in_RCX);
      }
      if (ioptr_00 < (float *)0xc) {
        ibfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                  in_stack_00000070,in_stack_00000068);
      }
      else {
        ifftrecurs(ioptr_00,in_RDX,in_RCX,in_R8,CONCAT44(scale_00,in_stack_ffffffffffffffd0),
                   StageCnt_00);
      }
      in_RDI = in_RDI + (1L << ((byte)ioptr_00 & 0x3f)) * 2;
    }
  }
  return;
}

Assistant:

void riffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place real ifft on the rows of the input array	*/
/* data order as from rffts1 */
/* INPUTS */
/* *ioptr = input data array in the following order	*/
/* M = log2 of fft size	*/
/* Re(x[0]), Re(x[N/2]), Re(x[1]), Im(x[1]), Re(x[2]), Im(x[2]), ... Re(x[N/2-1]), Im(x[N/2-1]). */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = real output data array	*/

float	scale;
long 	StageCnt;
long 	NDiffU;

scale = 1.0/POW2(M);
M=M-1;
switch (M){
case -1:
	break;
case 0:
	for (;Rows>0;Rows--){
		rifft1pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
case 1:
	for (;Rows>0;Rows--){
		rifft2pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		rifft4pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		rifft8pt(ioptr, scale);				/* a 16 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		ifrstage(ioptr, M+1, Utbl);

		scbitrevR2(ioptr, M, BRLow, scale);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);			/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE){
			ibfstages(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		else{
			ifftrecurs(ioptr, M, Utbl, 2, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}